

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::buildEscapedAndQuotedStringForUSDA(string *__return_storage_ptr__,string *str)

{
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  allocator local_f1;
  undefined1 local_f0 [8];
  string delim_1;
  undefined1 local_c8 [6];
  bool has_double_quote;
  bool has_single_quote;
  string local_a8;
  string local_88;
  string local_68;
  allocator local_41;
  undefined1 local_40 [8];
  string delim;
  bool has_triple_double_quoted_string;
  bool has_triple_single_quoted_string;
  bool has_newline;
  string *str_local;
  string *s;
  
  delim.field_2._M_local_buf[0xf] = hasNewline(str);
  delim.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((delim.field_2._M_local_buf[0xf] & 1U) == 0) {
    delim_1.field_2._M_local_buf[0xf] = hasQuotes(str,false);
    delim_1.field_2._M_local_buf[0xe] = hasQuotes(str,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f0,"\"",&local_f1);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    if (((delim_1.field_2._M_local_buf[0xf] & 1U) == 0) ||
       ((delim_1.field_2._M_local_buf[0xe] & 1U) == 0)) {
      if ((delim_1.field_2._M_local_buf[0xf] & 1U) == 0) {
        if ((delim_1.field_2._M_local_buf[0xe] & 1U) == 0) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)str);
        }
        else {
          std::__cxx11::string::operator=((string *)local_f0,"\'");
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)str);
        }
      }
      else {
        escapeSingleQuote(&local_138,str,false);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    else {
      escapeSingleQuote(&local_118,str,true);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    escapeControlSequence(&local_178,__return_storage_ptr__);
    quote(&local_158,&local_178,(string *)local_f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    delim.field_2._M_local_buf[0xd] = hasTripleQuotes(str,false);
    delim.field_2._M_local_buf[0xc] = hasTripleQuotes(str,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,"\"\"\"",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (((delim.field_2._M_local_buf[0xd] & 1U) == 0) ||
       ((delim.field_2._M_local_buf[0xc] & 1U) == 0)) {
      if ((delim.field_2._M_local_buf[0xd] & 1U) == 0) {
        if ((delim.field_2._M_local_buf[0xc] & 1U) == 0) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)str);
        }
        else {
          std::__cxx11::string::operator=((string *)local_40,"\'\'\'");
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)str);
        }
      }
      else {
        escapeSingleQuote(&local_88,str,false);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    else {
      escapeSingleQuote(&local_68,str,true);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    escapeControlSequence((string *)local_c8,__return_storage_ptr__);
    quote(&local_a8,(string *)local_c8,(string *)local_40);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string buildEscapedAndQuotedStringForUSDA(const std::string &str) {
  // Rule for triple quote string:
  //
  // if str contains newline
  //   if str contains """ and '''
  //      use quote """ and escape " to \\", no escape for '''
  //   elif str contains """ only
  //      use quote ''' and no escape for """
  //   elif str contains ''' only
  //      use quote """ and no escape for '''
  //   else
  //      use quote """
  //
  // Rule for single quote string
  //   if str contains " and '
  //      use quote " and escape " to \\", no escape for '
  //   elif str contains " only
  //      use quote ' and no escape for "
  //   elif str contains ' only
  //      use quote " and no escape for '
  //   else
  //      use quote "

  bool has_newline = hasNewline(str);

  std::string s;

  if (has_newline) {
    bool has_triple_single_quoted_string = hasTripleQuotes(str, false);
    bool has_triple_double_quoted_string = hasTripleQuotes(str, true);

    std::string delim = "\"\"\"";
    if (has_triple_single_quoted_string && has_triple_double_quoted_string) {
      s = escapeSingleQuote(str, true);
    } else if (has_triple_single_quoted_string) {
      s = escapeSingleQuote(str, false);
    } else if (has_triple_double_quoted_string) {
      delim = "'''";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);

  } else {
    // single quote string.
    bool has_single_quote = hasQuotes(str, false);
    bool has_double_quote = hasQuotes(str, true);

    std::string delim = "\"";
    if (has_single_quote && has_double_quote) {
      s = escapeSingleQuote(str, true);
    } else if (has_single_quote) {
      s = escapeSingleQuote(str, false);
    } else if (has_double_quote) {
      delim = "'";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);
  }

  return s;
}